

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O3

void crnlib::LzmaEnc_Destruct(CLzmaEnc *p,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  MatchFinder_Free(&p->matchFinderBase,allocBig);
  (*alloc->Free)(alloc,p->litProbs);
  (*alloc->Free)(alloc,(p->saveState).litProbs);
  p->litProbs = (UInt16 *)0x0;
  (p->saveState).litProbs = (UInt16 *)0x0;
  (*alloc->Free)(alloc,(p->rc).bufBase);
  (p->rc).bufBase = (Byte *)0x0;
  return;
}

Assistant:

void LzmaEnc_Destruct(CLzmaEnc* p, ISzAlloc* alloc, ISzAlloc* allocBig) {
#ifdef COMPRESS_MF_MT
  MatchFinderMt_Destruct(&p->matchFinderMt, allocBig);
#endif
  MatchFinder_Free(&p->matchFinderBase, allocBig);
  LzmaEnc_FreeLits(p, alloc);
  RangeEnc_Free(&p->rc, alloc);
}